

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase153::run(TestCase153 *this)

{
  Arena arena;
  Arena local_198;
  Runnable local_178;
  Arena *local_170;
  NullableValue<kj::Exception> local_168;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 1;
  Arena::Arena(&local_198,0x400);
  Arena::allocate<kj::(anonymous_namespace)::TestObject>(&local_198);
  local_178._vptr_Runnable = (_func_int **)&PTR_run_004580a0;
  local_170 = &local_198;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_168,&local_178);
  if (local_168.isSet == true) {
    Exception::~Exception(&local_168.field_1.value);
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[97]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xa1,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { arena.allocate<TestObject>(); }) != nullptr\""
               ,(char (*) [97])
                "failed: expected ::kj::runCatchingExceptions([&]() { arena.allocate<TestObject>(); }) != nullptr"
              );
  }
  if (((anonymous_namespace)::TestObject::count != 1) && (_::Debug::minSeverity < 3)) {
    local_168.isSet = true;
    local_168._1_3_ = 0;
    _::Debug::log<char_const(&)[44],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xa2,ERROR,
               "\"failed: expected \" \"(1) == (TestObject::count)\", 1, TestObject::count",
               (char (*) [44])"failed: expected (1) == (TestObject::count)",(int *)&local_168,
               &(anonymous_namespace)::TestObject::count);
  }
  Arena::~Arena(&local_198);
  if (((anonymous_namespace)::TestObject::count != 0) && (_::Debug::minSeverity < 3)) {
    local_168.isSet = false;
    local_168._1_3_ = 0;
    _::Debug::log<char_const(&)[44],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xa5,ERROR,
               "\"failed: expected \" \"(0) == (TestObject::count)\", 0, TestObject::count",
               (char (*) [44])"failed: expected (0) == (TestObject::count)",(int *)&local_168,
               &(anonymous_namespace)::TestObject::count);
  }
  return;
}

Assistant:

TEST(AsyncUnixTest, SignalsMultiListen) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  port.onSignal(SIGIO).then([](siginfo_t&&) {
    KJ_FAIL_EXPECT("Received wrong signal.");
  }).detach([](kj::Exception&& exception) {
    KJ_FAIL_EXPECT(exception);
  });

  kill(getpid(), SIGURG);

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
  EXPECT_SI_CODE(SI_USER, info.si_code);
}